

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3PutColNumber(char **pp,int iCol)

{
  char *pcVar1;
  int iVar2;
  
  if (iCol != 0) {
    pcVar1 = *pp;
    iVar2 = sqlite3Fts3PutVarint(pcVar1 + 1,(long)iCol);
    *pcVar1 = '\x01';
    *pp = pcVar1 + (long)iVar2 + 1;
    return iVar2 + 1;
  }
  return 0;
}

Assistant:

static int fts3PutColNumber(char **pp, int iCol){
  int n = 0;                      /* Number of bytes written */
  if( iCol ){
    char *p = *pp;                /* Output pointer */
    n = 1 + sqlite3Fts3PutVarint(&p[1], iCol);
    *p = 0x01;
    *pp = &p[n];
  }
  return n;
}